

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_and_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  byte bVar1;
  ushort key;
  ushort x;
  int iVar2;
  container_t *candidate_shared_container;
  int iVar3;
  _Bool _Var4;
  uint uVar5;
  uint pos;
  array_container_t *paVar6;
  array_container_t *paVar7;
  run_container_t *dst;
  array_container_t *dst_00;
  ulong uVar8;
  long lVar9;
  int pos_00;
  ulong uVar10;
  uint8_t result_type;
  byte local_7a;
  byte local_79;
  array_container_t *local_78;
  uint local_6c;
  array_container_t *local_68;
  int local_5c;
  array_container_t *local_58;
  roaring_array_t *local_50;
  int32_t local_44;
  array_container_t *local_40;
  array_container_t *local_38;
  
  if (x1 == x2) {
    return;
  }
  iVar2 = (x1->high_low_container).size;
  local_44 = (x2->high_low_container).size;
  local_5c = 0;
  uVar10 = 0;
  pos = 0;
  local_50 = &x2->high_low_container;
LAB_001111ec:
  uVar8 = uVar10 & 0xffff;
LAB_001111f0:
  if ((iVar2 <= (int)pos) || (pos_00 = (int)uVar10, local_44 <= pos_00)) {
    for (lVar9 = (long)(int)pos; lVar9 < iVar2; lVar9 = lVar9 + 1) {
      container_free((x1->high_low_container).containers[lVar9],
                     (x1->high_low_container).typecodes[lVar9]);
    }
    ra_downsize(&x1->high_low_container,local_5c);
    return;
  }
  uVar5 = pos & 0xffff;
  key = (x1->high_low_container).keys[uVar5];
  x = local_50->keys[uVar8];
  if (key == x) {
    bVar1 = (x1->high_low_container).typecodes[uVar5];
    paVar7 = (array_container_t *)(x1->high_low_container).containers[uVar5];
    candidate_shared_container = local_50->containers[uVar8];
    local_6c = CONCAT31(local_6c._1_3_,bVar1);
    if (bVar1 == 4) {
      paVar6 = (array_container_t *)
               container_and(paVar7,'\x04',candidate_shared_container,local_50->typecodes[uVar8],
                             &result_type);
      goto LAB_00111437;
    }
    local_7a = local_50->typecodes[uVar8];
    local_79 = bVar1;
    local_38 = paVar7;
    local_78 = (array_container_t *)get_writable_copy_if_shared(paVar7,&local_79);
    local_40 = local_78;
    paVar7 = (array_container_t *)container_unwrap_shared(candidate_shared_container,&local_7a);
    local_58 = (array_container_t *)0x0;
    switch((uint)local_7a + (uint)local_79 * 4) {
    case 5:
      _Var4 = bitset_bitset_container_intersection_inplace
                        ((bitset_container_t *)local_78,(bitset_container_t *)paVar7,&local_58);
      goto LAB_00111417;
    case 6:
      local_68 = paVar7;
      paVar7 = array_container_create();
      array_bitset_container_intersection(local_68,(bitset_container_t *)local_78,paVar7);
      result_type = '\x02';
      local_78 = paVar7;
      break;
    case 7:
      _Var4 = run_bitset_container_intersection
                        ((run_container_t *)paVar7,(bitset_container_t *)local_78,&local_40);
      result_type = '\x02' - _Var4;
      local_78 = local_40;
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1400,
                    "container_t *container_iand(container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                   );
    case 9:
      result_type = '\x02';
      array_bitset_container_intersection(local_78,(bitset_container_t *)paVar7,local_78);
      break;
    case 10:
      array_container_intersection_inplace(local_78,paVar7);
      result_type = '\x02';
      break;
    case 0xb:
      local_68 = paVar7;
      dst_00 = array_container_create();
      paVar7 = local_68;
      paVar6 = local_78;
      goto LAB_001113bf;
    case 0xd:
      _Var4 = run_bitset_container_intersection
                        ((run_container_t *)local_78,(bitset_container_t *)paVar7,&local_58);
LAB_00111417:
      result_type = '\x02' - _Var4;
      local_78 = local_58;
      break;
    case 0xe:
      local_68 = paVar7;
      dst_00 = array_container_create();
      paVar7 = local_78;
      paVar6 = local_68;
LAB_001113bf:
      result_type = '\x02';
      array_run_container_intersection(paVar6,(run_container_t *)paVar7,dst_00);
      local_78 = dst_00;
      break;
    case 0xf:
      local_68 = paVar7;
      dst = run_container_create();
      run_container_intersection((run_container_t *)local_78,(run_container_t *)local_68,dst);
      local_78 = (array_container_t *)convert_run_to_efficient_container_and_free(dst,&result_type);
    }
    paVar7 = local_38;
    paVar6 = local_78;
LAB_00111437:
    if (paVar6 != paVar7) {
      container_free(paVar7,(uint8_t)local_6c);
    }
    local_6c = (uint)result_type;
    _Var4 = container_nonzero_cardinality(paVar6,result_type);
    iVar3 = local_5c;
    if (_Var4) {
      ra_replace_key_and_container_at_index
                (&x1->high_low_container,local_5c,key,paVar6,(uint8_t)local_6c);
      local_5c = iVar3 + 1;
    }
    else {
      container_free(paVar6,(uint8_t)local_6c);
    }
    pos = pos + 1;
    uVar10 = (ulong)(pos_00 + 1);
  }
  else {
    if (key < x) goto code_r0x00111224;
    uVar5 = ra_advance_until(local_50,key,pos_00);
    uVar10 = (ulong)uVar5;
  }
  goto LAB_001111ec;
code_r0x00111224:
  pos = ra_advance_until_freeing(&x1->high_low_container,x,pos);
  goto LAB_001111f0;
}

Assistant:

void roaring_bitmap_and_inplace(roaring_bitmap_t *x1,
                                const roaring_bitmap_t *x2) {
    if (x1 == x2) return;
    int pos1 = 0, pos2 = 0, intersection_size = 0;
    const int length1 = ra_get_size(&x1->high_low_container);
    const int length2 = ra_get_size(&x2->high_low_container);

    // any skipped-over or newly emptied containers in x1
    // have to be freed.
    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
        const uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        if (s1 == s2) {
            uint8_t type1, type2, result_type;
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared container.
            // Rationale: using a shared container safely with in place computation would
            // require making a copy and then doing the computation in place which is likely
            // less efficient than avoiding in place entirely and always generating a new
            // container.
            container_t *c =
                (type1 == SHARED_CONTAINER_TYPE)
                    ? container_and(c1, type1, c2, type2, &result_type)
                    : container_iand(c1, type1, c2, type2, &result_type);

            if (c != c1) {  // in this instance a new container was created, and
                            // we need to free the old one
                container_free(c1, type1);
            }
            if (container_nonzero_cardinality(c, result_type)) {
                ra_replace_key_and_container_at_index(&x1->high_low_container,
                                                      intersection_size, s1, c,
                                                      result_type);
                intersection_size++;
            } else {
                container_free(c, result_type);
            }
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {
            pos1 = ra_advance_until_freeing(&x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
        }
    }

    // if we ended early because x2 ran out, then all remaining in x1 should be
    // freed
    while (pos1 < length1) {
        container_free(x1->high_low_container.containers[pos1],
                       x1->high_low_container.typecodes[pos1]);
        ++pos1;
    }

    // all containers after this have either been copied or freed
    ra_downsize(&x1->high_low_container, intersection_size);
}